

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

void __thiscall
iqnet::Reactor<boost::mutex>::unregister_handler
          (Reactor<boost::mutex> *this,Event_handler *eh,Event_mask mask)

{
  size_t *psVar1;
  ushort uVar2;
  int iVar3;
  _List_node_base *p_Var4;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::_Rb_tree_iterator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
  pVar5;
  scoped_lock lk;
  unique_lock<boost::mutex> local_40;
  int local_2c;
  
  local_40.m = &this->lock;
  local_40.is_locked = false;
  boost::unique_lock<boost::mutex>::lock(&local_40);
  p_Var4 = (this->handlers_states).
           super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  iVar3 = (*eh->_vptr_Event_handler[9])(eh);
  for (; (p_Var4 != (_List_node_base *)&this->handlers_states &&
         (*(int *)&p_Var4[1]._M_next != iVar3)); p_Var4 = p_Var4->_M_next) {
  }
  if ((p_Var4 != (_List_node_base *)&this->handlers_states) &&
     (uVar2 = (ushort)(mask == 0) & *(ushort *)((long)&p_Var4[1]._M_next + 4),
     *(ushort *)((long)&p_Var4[1]._M_next + 4) = uVar2, uVar2 == 0)) {
    local_2c = (*eh->_vptr_Event_handler[9])(eh);
    pVar5 = std::
            _Rb_tree<int,_std::pair<const_int,_iqnet::Event_handler_*>,_std::_Select1st<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
            ::equal_range(&(this->handlers)._M_t,&local_2c);
    std::
    _Rb_tree<int,_std::pair<const_int,_iqnet::Event_handler_*>,_std::_Select1st<std::pair<const_int,_iqnet::Event_handler_*>_>,_std::less<int>,_std::allocator<std::pair<const_int,_iqnet::Event_handler_*>_>_>
    ::_M_erase_aux(&(this->handlers)._M_t,(_Base_ptr)pVar5.first._M_node,
                   (_Base_ptr)pVar5.second._M_node);
    psVar1 = &(this->handlers_states).
              super__List_base<iqnet::Reactor_base::HandlerState,_std::allocator<iqnet::Reactor_base::HandlerState>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(p_Var4,0x18);
    iVar3 = (*eh->_vptr_Event_handler[2])(eh);
    if ((char)iVar3 != '\0') {
      this->num_stoppers = this->num_stoppers - 1;
    }
  }
  if (local_40.is_locked == true) {
    boost::mutex::unlock(local_40.m);
  }
  return;
}

Assistant:

void Reactor<Lock>::unregister_handler( Event_handler* eh, Event_mask mask )
{
  scoped_lock lk(lock);
  hs_iterator i = find_handler_state( eh );

  if( i != end() )
  {
    int newmask = (i->mask &= !mask);

    if( !newmask )
    {
      handlers.erase(eh->get_handler());
      handlers_states.erase(i);

      if (eh->is_stopper())
        num_stoppers--;
    }
  }
}